

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverMaxPlus.h
# Opt level: O2

void __thiscall
BGIP_SolverMaxPlus<JointPolicyPureVectorForClusteredBG>::BGIP_SolverMaxPlus
          (BGIP_SolverMaxPlus<JointPolicyPureVectorForClusteredBG> *this,
          shared_ptr<const_BayesianGameIdenticalPayoffInterface> *bg,size_t maxiter,
          string *updateType,size_t verbosity,double damping,size_t nrSolutions,size_t nrRestarts)

{
  string local_48 [32];
  
  BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>::
  BayesianGameIdenticalPayoffSolver_T
            (&this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG>,
             bg,1);
  std::__cxx11::string::string(local_48,(string *)updateType);
  MaxPlusSolverForBGs::MaxPlusSolverForBGs
            ((MaxPlusSolverForBGs *)damping,&this->super_MaxPlusSolverForBGs,maxiter,local_48,
             verbosity & 0xffffffff,nrSolutions,nrRestarts);
  std::__cxx11::string::~string(local_48);
  *(undefined ***)
   &this->super_BayesianGameIdenticalPayoffSolver_T<JointPolicyPureVectorForClusteredBG> =
       &PTR_InitDeadline_001366b0;
  return;
}

Assistant:

BGIP_SolverMaxPlus(
            const boost::shared_ptr<const BayesianGameIdenticalPayoffInterface> &bg,
            size_t maxiter = 1000,
            std::string updateType=std::string("PARALL"),
            size_t verbosity = 2,
            double damping = 0.0,
            size_t nrSolutions = 1,
            size_t nrRestarts = 1
        ) :
        BayesianGameIdenticalPayoffSolver_T<JP>(bg),
        MaxPlusSolverForBGs(maxiter, updateType, verbosity, damping, nrSolutions, nrRestarts)
        {}